

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O0

void __thiscall FNodeBuilder::ExtractMini(FNodeBuilder *this,FMiniBSP *bsp)

{
  fixed_t x;
  uint uVar1;
  DWORD DVar2;
  vertex_t *pvVar3;
  FPrivVert *pFVar4;
  subsector_t *psVar5;
  node_t *pnVar6;
  node_t *pnVar7;
  seg_t *psVar8;
  glseg_t *__src;
  subsector_t *__src_00;
  USegPtr *pUVar9;
  FPrivSeg *pFVar10;
  double dVar11;
  seg_t *out;
  FPrivSeg *org;
  DWORD numsegs;
  undefined1 local_38 [8];
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> glsegs;
  int k;
  int j_1;
  int j;
  uint i;
  FMiniBSP *bsp_local;
  FNodeBuilder *this_local;
  
  bsp->bDirty = false;
  uVar1 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Size(&this->Vertices);
  TArray<vertex_t,_vertex_t>::Resize(&bsp->Verts,uVar1);
  for (j_1 = 0; uVar1 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Size
                                  (&this->Vertices), (uint)j_1 < uVar1; j_1 = j_1 + 1) {
    pvVar3 = TArray<vertex_t,_vertex_t>::operator[](&bsp->Verts,(ulong)(uint)j_1);
    pFVar4 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(ulong)(uint)j_1);
    x = (pFVar4->super_FSimpleVert).x;
    pFVar4 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(ulong)(uint)j_1);
    vertex_t::set(pvVar3,x,(pFVar4->super_FSimpleVert).y);
  }
  uVar1 = TArray<subsector_t,_subsector_t>::Size(&this->Subsectors);
  TArray<subsector_t,_subsector_t>::Resize(&bsp->Subsectors,uVar1);
  psVar5 = TArray<subsector_t,_subsector_t>::operator[](&bsp->Subsectors,0);
  uVar1 = TArray<subsector_t,_subsector_t>::Size(&this->Subsectors);
  memset(psVar5,0,(ulong)uVar1 * 0x30);
  uVar1 = TArray<node_t,_node_t>::Size(&this->Nodes);
  TArray<node_t,_node_t>::Resize(&bsp->Nodes,uVar1);
  pnVar6 = TArray<node_t,_node_t>::operator[](&bsp->Nodes,0);
  pnVar7 = TArray<node_t,_node_t>::operator[](&this->Nodes,0);
  uVar1 = TArray<node_t,_node_t>::Size(&this->Nodes);
  memcpy(pnVar6,pnVar7,(ulong)uVar1 * 0x48);
  for (j_1 = 0; uVar1 = TArray<node_t,_node_t>::Size(&this->Nodes), (uint)j_1 < uVar1; j_1 = j_1 + 1
      ) {
    for (k = 1; -1 < k; k = k + -1) {
      pnVar6 = TArray<node_t,_node_t>::operator[](&bsp->Nodes,(ulong)(uint)j_1);
      if ((*(uint *)((long)&pnVar6->field_6 + (long)k * 4) & 0x80000000) == 0) {
        pnVar6 = TArray<node_t,_node_t>::operator[](&bsp->Nodes,(ulong)(uint)j_1);
        pnVar6 = TArray<node_t,_node_t>::operator[]
                           (&bsp->Nodes,(long)*(int *)((long)&pnVar6->field_6 + (long)k * 4));
        pnVar7 = TArray<node_t,_node_t>::operator[](&bsp->Nodes,(ulong)(uint)j_1);
        *(node_t **)((long)&pnVar7->field_6 + (long)k * 8) = pnVar6;
      }
      else {
        pnVar6 = TArray<node_t,_node_t>::operator[](&bsp->Nodes,(ulong)(uint)j_1);
        psVar5 = TArray<subsector_t,_subsector_t>::operator[]
                           (&bsp->Subsectors,
                            (long)(int)(*(uint *)((long)&pnVar6->field_6 + (long)k * 4) & 0x7fffffff
                                       ));
        pnVar6 = TArray<node_t,_node_t>::operator[](&bsp->Nodes,(ulong)(uint)j_1);
        *(undefined1 **)((long)&pnVar6->field_6 + (long)k * 8) =
             (undefined1 *)((long)&psVar5->sector + 1);
      }
    }
    for (glsegs.Count = 0; (int)glsegs.Count < 2; glsegs.Count = glsegs.Count + 1) {
      for (glsegs.Most = 0; (int)glsegs.Most < 4; glsegs.Most = glsegs.Most + 1) {
        pnVar6 = TArray<node_t,_node_t>::operator[](&bsp->Nodes,(ulong)(uint)j_1);
        dVar11 = FixedToFloat(*(fixed_t *)
                               ((long)&pnVar6->field_4 +
                               (long)(int)glsegs.Most * 4 + (long)(int)glsegs.Count * 0x10));
        pnVar6 = TArray<node_t,_node_t>::operator[](&bsp->Nodes,(ulong)(uint)j_1);
        *(float *)((long)&pnVar6->field_4 +
                  (long)(int)glsegs.Most * 4 + (long)(int)glsegs.Count * 0x10) = (float)dVar11;
      }
    }
  }
  if ((this->GLNodes & 1U) == 0) {
    psVar5 = TArray<subsector_t,_subsector_t>::operator[](&bsp->Subsectors,0);
    __src_00 = TArray<subsector_t,_subsector_t>::operator[](&this->Subsectors,0);
    uVar1 = TArray<subsector_t,_subsector_t>::Size(&this->Subsectors);
    memcpy(psVar5,__src_00,(ulong)uVar1 * 0x30);
    uVar1 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs);
    TArray<seg_t,_seg_t>::Resize(&bsp->Segs,uVar1);
    for (j_1 = 0; uVar1 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs),
        (uint)j_1 < uVar1; j_1 = j_1 + 1) {
      pUVar9 = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::operator[]
                         (&this->SegList,(ulong)(uint)j_1);
      pFVar10 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                          (&this->Segs,(ulong)pUVar9->SegNum);
      psVar8 = TArray<seg_t,_seg_t>::operator[](&bsp->Segs,(ulong)(uint)j_1);
      pvVar3 = TArray<vertex_t,_vertex_t>::operator[](&bsp->Verts,(long)pFVar10->v1);
      psVar8->v1 = pvVar3;
      pvVar3 = TArray<vertex_t,_vertex_t>::operator[](&bsp->Verts,(long)pFVar10->v2);
      psVar8->v2 = pvVar3;
      psVar8->backsector = pFVar10->backsector;
      psVar8->frontsector = pFVar10->frontsector;
      if (pFVar10->sidedef == -1) {
        psVar8->linedef = (line_t_conflict *)0x0;
        psVar8->sidedef = (side_t *)0x0;
      }
      else {
        psVar8->linedef = this->Level->Lines + pFVar10->linedef;
        psVar8->sidedef = this->Level->Sides + pFVar10->sidedef;
      }
    }
    for (j_1 = 0; uVar1 = TArray<subsector_t,_subsector_t>::Size(&bsp->Subsectors),
        (uint)j_1 < uVar1; j_1 = j_1 + 1) {
      psVar5 = TArray<subsector_t,_subsector_t>::operator[](&bsp->Subsectors,(ulong)(uint)j_1);
      psVar8 = TArray<seg_t,_seg_t>::operator[](&bsp->Segs,(size_t)psVar5->firstline);
      psVar5 = TArray<subsector_t,_subsector_t>::operator[](&bsp->Subsectors,(ulong)(uint)j_1);
      psVar5->firstline = psVar8;
    }
  }
  else {
    TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::TArray
              ((TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)local_38);
    for (j_1 = 0; uVar1 = TArray<subsector_t,_subsector_t>::Size(&this->Subsectors),
        (uint)j_1 < uVar1; j_1 = j_1 + 1) {
      pvVar3 = TArray<vertex_t,_vertex_t>::operator[](&bsp->Verts,0);
      DVar2 = CloseSubsector(this,(TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)local_38,
                             j_1,pvVar3);
      psVar5 = TArray<subsector_t,_subsector_t>::operator[](&bsp->Subsectors,(ulong)(uint)j_1);
      psVar5->numlines = DVar2;
      uVar1 = TArray<seg_t,_seg_t>::Size(&bsp->Segs);
      psVar8 = TArray<seg_t,_seg_t>::operator[](&bsp->Segs,(ulong)(uVar1 - DVar2));
      psVar5 = TArray<subsector_t,_subsector_t>::operator[](&bsp->Subsectors,(ulong)(uint)j_1);
      psVar5->firstline = psVar8;
    }
    uVar1 = TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Size
                      ((TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)local_38);
    TArray<seg_t,_seg_t>::Resize(&bsp->Segs,uVar1);
    for (j_1 = 0; uVar1 = TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Size
                                    ((TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)
                                     local_38), (uint)j_1 < uVar1; j_1 = j_1 + 1) {
      __src = TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::operator[]
                        ((TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)local_38,
                         (ulong)(uint)j_1);
      psVar8 = TArray<seg_t,_seg_t>::operator[](&bsp->Segs,(ulong)(uint)j_1);
      memcpy(psVar8,__src,0x30);
    }
    TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::~TArray
              ((TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)local_38);
  }
  return;
}

Assistant:

void FNodeBuilder::ExtractMini (FMiniBSP *bsp)
{
	unsigned int i;

	bsp->bDirty = false;
	bsp->Verts.Resize(Vertices.Size());
	for (i = 0; i < Vertices.Size(); ++i)
	{
		bsp->Verts[i].set(Vertices[i].x, Vertices[i].y);
	}

	bsp->Subsectors.Resize(Subsectors.Size());
	memset(&bsp->Subsectors[0], 0, Subsectors.Size() * sizeof(subsector_t));

	bsp->Nodes.Resize(Nodes.Size());
	memcpy(&bsp->Nodes[0], &Nodes[0], Nodes.Size()*sizeof(node_t));
	for (i = 0; i < Nodes.Size(); ++i)
	{
		D(Printf(PRINT_LOG, "Node %d:\n", i));
		// Go backwards because on 64-bit systems, both of the intchildren are
		// inside the first in-game child.
		for (int j = 1; j >= 0; --j)
		{
			if (bsp->Nodes[i].intchildren[j] & 0x80000000)
			{
				D(Printf(PRINT_LOG, "  subsector %d\n", bsp->Nodes[i].intchildren[j] & 0x7FFFFFFF));
				bsp->Nodes[i].children[j] = (BYTE *)&bsp->Subsectors[bsp->Nodes[i].intchildren[j] & 0x7fffffff] + 1;
			}
			else
			{
				D(Printf(PRINT_LOG, "  node %d\n", bsp->Nodes[i].intchildren[j]));
				bsp->Nodes[i].children[j] = &bsp->Nodes[bsp->Nodes[i].intchildren[j]];
			}
		}
		for (int j = 0; j < 2; ++j)
		{
			for (int k = 0; k < 4; ++k)
			{
				bsp->Nodes[i].bbox[j][k] = FIXED2FLOAT(bsp->Nodes[i].nb_bbox[j][k]);
			}
		}
	}

	if (GLNodes)
	{
		TArray<glseg_t> glsegs;
		for (i = 0; i < Subsectors.Size(); ++i)
		{
			DWORD numsegs = CloseSubsector (glsegs, i, &bsp->Verts[0]);
			bsp->Subsectors[i].numlines = numsegs;
			bsp->Subsectors[i].firstline = &bsp->Segs[bsp->Segs.Size() - numsegs];
		}
		bsp->Segs.Resize(glsegs.Size());
		for (i = 0; i < glsegs.Size(); ++i)
		{
			bsp->Segs[i] = *(seg_t *)&glsegs[i];
		}
	}
	else
	{
		memcpy(&bsp->Subsectors[0], &Subsectors[0], Subsectors.Size()*sizeof(subsector_t));
		bsp->Segs.Resize(Segs.Size());
		for (i = 0; i < Segs.Size(); ++i)
		{
			const FPrivSeg *org = &Segs[SegList[i].SegNum];
			seg_t *out = &bsp->Segs[i];

			D(Printf(PRINT_LOG, "Seg %d: v1(%d) -> v2(%d)\n", i, org->v1, org->v2));

			out->v1 = &bsp->Verts[org->v1];
			out->v2 = &bsp->Verts[org->v2];
			out->backsector = org->backsector;
			out->frontsector = org->frontsector;
			if (org->sidedef != int(NO_SIDE))
			{
				out->linedef = Level.Lines + org->linedef;
				out->sidedef = Level.Sides + org->sidedef;
			}
			else	// part of a miniseg
			{
				out->linedef = NULL;
				out->sidedef = NULL;
			}
		}
		for (i = 0; i < bsp->Subsectors.Size(); ++i)
		{
			bsp->Subsectors[i].firstline = &bsp->Segs[(size_t)bsp->Subsectors[i].firstline];
		}
	}
}